

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

NodeSequence __thiscall
GraphBuilder::insertPthreadCreate(GraphBuilder *this,CallInst *callInstruction)

{
  long lVar1;
  long lVar2;
  ForkNode *this_00;
  CallInst *callInst;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> *__range1;
  Instruction *instruction;
  pointer ppFVar3;
  NodeSequence NVar4;
  NodeSequence NVar5;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> functionsToBeForked;
  vector<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_> local_38;
  
  lVar1 = *(long *)(callInstruction + -0x20);
  lVar2 = 0;
  if ((lVar1 != 0) && (*(char *)(lVar1 + 0x10) == '\0')) {
    lVar2 = lVar1;
  }
  if ((lVar2 == 0) || (*(long *)(lVar2 + 0x18) != *(long *)(callInstruction + 0x48))) {
    this_00 = (ForkNode *)operator_new(0xe0);
    callInst = callInstruction;
    instruction = (Instruction *)0x0;
  }
  else {
    this_00 = (ForkNode *)operator_new(0xe0);
    callInst = (CallInst *)0x0;
    instruction = (Instruction *)callInstruction;
  }
  ForkNode::ForkNode(this_00,instruction,callInst);
  NVar5.first = addNode<ForkNode>(this,this_00);
  dg::getCalledFunctions
            (&local_38,
             *(Value **)
              (callInstruction + (0x40 - (ulong)(uint)(*(int *)(callInstruction + 0x14) << 5))),
             (LLVMPointerAnalysis *)this->pointsToAnalysis_);
  for (ppFVar3 = local_38.
                 super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppFVar3 !=
      local_38.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppFVar3 = ppFVar3 + 1) {
    NVar4 = createOrGetFunction(this,*ppFVar3);
    if ((EntryNode *)NVar4.first != (EntryNode *)0x0) {
      ForkNode::addForkSuccessor(NVar5.first,(EntryNode *)NVar4.first);
    }
  }
  if (local_38.super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<const_llvm::Function_*,_std::allocator<const_llvm::Function_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  NVar5.second = &(NVar5.first)->super_Node;
  return NVar5;
}

Assistant:

GraphBuilder::NodeSequence
GraphBuilder::insertPthreadCreate(const CallInst *callInstruction) {
    ForkNode *forkNode;
    if (callInstruction->getCalledFunction()) {
        forkNode = addNode(createNode<NodeType::FORK>(callInstruction));
    } else {
        forkNode =
                addNode(createNode<NodeType::FORK>(nullptr, callInstruction));
    }
    auto *possibleFunction = callInstruction->getArgOperand(2);
    auto functionsToBeForked =
            getCalledFunctions(possibleFunction, pointsToAnalysis_);
    for (const auto *function : functionsToBeForked) {
        auto graph = createOrGetFunction(function);
        if (graph.first) {
            forkNode->addForkSuccessor(static_cast<EntryNode *>(graph.first));
        }
    }
    return {forkNode, forkNode};
}